

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SectHdrsWrapper.cpp
# Opt level: O2

QString * SectionHdrWrapper::getSecHdrAccessRightsDesc
                    (QString *__return_storage_ptr__,DWORD characteristics)

{
  char rights [4];
  undefined4 local_c;
  
  local_c = 0x2d2d2d;
  if ((characteristics >> 0x1e & 1) != 0) {
    local_c = 0x2d2d72;
  }
  if ((int)characteristics < 0) {
    local_c._0_2_ = CONCAT11(0x77,(char)local_c);
  }
  if ((characteristics >> 0x1d & 1) != 0) {
    local_c = (uint)CONCAT12(0x78,(undefined2)local_c);
  }
  QString::QString(__return_storage_ptr__,(char *)&local_c);
  return __return_storage_ptr__;
}

Assistant:

QString SectionHdrWrapper::getSecHdrAccessRightsDesc(DWORD characteristics)
{
    char rights[] = "---";

    if (characteristics & SCN_MEM_READ)
        rights[0] = 'r';
    if (characteristics & SCN_MEM_WRITE)
        rights[1] = 'w';
    if (characteristics & SCN_MEM_EXECUTE)
        rights[2] = 'x';
    return rights;
}